

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O1

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneBspTreeIndexPrivate::estimateItems
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsSceneBspTreeIndexPrivate *this,
          QRectF *rect,SortOrder order,bool onlyTopLevelItems)

{
  long lVar1;
  QGraphicsItem **b;
  long lVar2;
  QGraphicsItem *this_00;
  ulong uVar3;
  qsizetype i;
  undefined7 in_register_00000081;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QGraphicsItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (ulong)onlyTopLevelItems;
  if ((int)CONCAT71(in_register_00000081,onlyTopLevelItems) == 0) {
    purgeRemovedItems(this);
    _q_updateSortCache(this);
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneBspTree::items(__return_storage_ptr__,&this->bsp,rect,false);
LAB_006328da:
    b = (this->untransformableItems).d.ptr;
    QtPrivate::QCommonArrayOps<QGraphicsItem_*>::growAppend
              ((QCommonArrayOps<QGraphicsItem_*> *)__return_storage_ptr__,b,
               b + (this->untransformableItems).d.size);
  }
  else {
    if ((((rect->w == 0.0) && (!NAN(rect->w))) && (rect->h == 0.0)) && (!NAN(rect->h))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QGraphicsSceneIndex::estimateTopLevelItems
                  (__return_storage_ptr__,
                   *(QGraphicsSceneIndex **)&(this->super_QGraphicsSceneIndexPrivate).field_0x8,rect
                   ,order);
        return __return_storage_ptr__;
      }
      goto LAB_00632a31;
    }
    purgeRemovedItems(this);
    _q_updateSortCache(this);
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneBspTree::items(__return_storage_ptr__,&this->bsp,rect,onlyTopLevelItems);
    if (!onlyTopLevelItems) goto LAB_006328da;
    if ((this->untransformableItems).d.size != 0) {
      uVar5 = 0;
      do {
        this_00 = (this->untransformableItems).d.ptr[uVar5];
        if (((this_00->d_ptr).d)->parent == (QGraphicsItem *)0x0) {
          i = (__return_storage_ptr__->d).size;
LAB_00632a09:
          local_40 = this_00;
          QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                    ((QPodArrayOps<QGraphicsItem*> *)__return_storage_ptr__,i,&local_40);
          QList<QGraphicsItem_*>::end(__return_storage_ptr__);
        }
        else {
          this_00 = QGraphicsItem::topLevelItem(this_00);
          i = (__return_storage_ptr__->d).size;
          if (i == 0) {
LAB_006329ec:
            uVar3 = 0xffffffffffffffff;
          }
          else {
            uVar4 = 0xfffffffffffffff8;
            do {
              lVar1 = i * -8 + uVar4;
              if (lVar1 == -8) goto LAB_006329e6;
              uVar3 = uVar4 + 8;
              lVar2 = uVar4 + 8;
              uVar4 = uVar3;
            } while (*(QGraphicsItem **)((long)(__return_storage_ptr__->d).ptr + lVar2) != this_00);
            uVar3 = (long)uVar3 >> 3;
LAB_006329e6:
            if (lVar1 == -8) goto LAB_006329ec;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_00632a09;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)(this->untransformableItems).d.size);
    }
  }
  sortItems(__return_storage_ptr__,order,this->sortCacheEnabled,onlyTopLevelItems);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00632a31:
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneBspTreeIndexPrivate::estimateItems(const QRectF &rect, Qt::SortOrder order,
                                                                        bool onlyTopLevelItems)
{
    Q_Q(QGraphicsSceneBspTreeIndex);
    if (onlyTopLevelItems && rect.isNull())
        return q->QGraphicsSceneIndex::estimateTopLevelItems(rect, order);

    purgeRemovedItems();
    _q_updateSortCache();
    Q_ASSERT(unindexedItems.isEmpty());

    QList<QGraphicsItem *> rectItems = bsp.items(rect, onlyTopLevelItems);
    if (onlyTopLevelItems) {
        for (int i = 0; i < untransformableItems.size(); ++i) {
            QGraphicsItem *item = untransformableItems.at(i);
            if (!item->d_ptr->parent) {
                rectItems << item;
            } else {
                item = item->topLevelItem();
                if (!rectItems.contains(item))
                    rectItems << item;
            }
        }
    } else {
        rectItems += untransformableItems;
    }

    sortItems(&rectItems, order, sortCacheEnabled, onlyTopLevelItems);
    return rectItems;
}